

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

HierarchicalValueExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::HierarchicalValueExpression,slang::ast::Scope_const&,slang::ast::ValueSymbol_const&,slang::ast::HierarchicalReference_const&,slang::SourceRange&>
          (BumpAllocator *this,Scope *args,ValueSymbol *args_1,HierarchicalReference *args_2,
          SourceRange *args_3)

{
  SourceRange sourceRange;
  HierarchicalValueExpression *pHVar1;
  HierarchicalValueExpression *in_RCX;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  Scope *in_R8;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pHVar1 = (HierarchicalValueExpression *)
           allocate((BumpAllocator *)in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  sourceRange.endLoc = in_RSI;
  sourceRange.startLoc = in_RDX;
  ast::HierarchicalValueExpression::HierarchicalValueExpression
            (in_RCX,in_R8,(ValueSymbol *)in_R8->thisSym,(HierarchicalReference *)in_R8->compilation,
             sourceRange);
  return pHVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }